

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraZddGetSymmetricVars(DdManager *dd,DdNode *bF,DdNode *bG,DdNode *bVars)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdHalfWord local_b0;
  DdHalfWord local_ac;
  DdNode *bVarsExtra;
  int LevelFG;
  int LevelG;
  int LevelF;
  DdNode *bVarsNew;
  DdNode *bG1;
  DdNode *bG0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *zTemp;
  DdNode *zPlus;
  DdNode *zRes1;
  DdNode *zRes0;
  DdNode *bGR;
  DdNode *bFR;
  DdNode *zRes;
  DdNode *bVars_local;
  DdNode *bG_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar2 = (DdNode *)((ulong)bG & 0xfffffffffffffffe);
  if ((pDVar1->index == 0x7fffffff) && (pDVar2->index == 0x7fffffff)) {
    if (bF == bG) {
      dd_local = (DdManager *)extraZddGetSingletons(dd,bVars);
    }
    else {
      dd_local = (DdManager *)dd->zero;
    }
  }
  else {
    if (bVars == dd->one) {
      __assert_fail("bVars != b1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                    ,0x335,
                    "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
    }
    dd_local = (DdManager *)cuddCacheLookupZdd(dd,10,bF,bG,bVars);
    if (dd_local == (DdManager *)0x0) {
      if (pDVar1->index == 0x7fffffff) {
        local_ac = pDVar1->index;
      }
      else {
        local_ac = dd->perm[pDVar1->index];
      }
      if (pDVar2->index == 0x7fffffff) {
        local_b0 = pDVar2->index;
      }
      else {
        local_b0 = dd->perm[pDVar2->index];
      }
      if ((int)local_ac < (int)local_b0) {
        bVarsExtra._4_4_ = local_ac;
      }
      else {
        bVarsExtra._4_4_ = local_b0;
      }
      _LevelG = bVars;
      if (dd->size <= (int)bVarsExtra._4_4_) {
        __assert_fail("LevelFG < dd->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                      ,0x34b,
                      "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)")
        ;
      }
      while (dd->perm[_LevelG->index] < (int)bVarsExtra._4_4_) {
        _LevelG = (_LevelG->type).kids.T;
      }
      if (bVarsExtra._4_4_ != dd->perm[_LevelG->index]) {
        __assert_fail("LevelFG == dd->perm[bVarsNew->index]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                      ,0x350,
                      "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)")
        ;
      }
      bG0 = bF;
      bF1 = bF;
      if (local_ac == bVarsExtra._4_4_) {
        if (pDVar1 == bF) {
          bF1 = (pDVar1->type).kids.E;
          bG0 = (pDVar1->type).kids.T;
        }
        else {
          bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
          bG0 = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
        }
      }
      bVarsNew = bG;
      bG1 = bG;
      if (local_b0 == bVarsExtra._4_4_) {
        if (pDVar2 == bG) {
          bG1 = (pDVar2->type).kids.E;
          bVarsNew = (pDVar2->type).kids.T;
        }
        else {
          bG1 = (DdNode *)((ulong)(pDVar2->type).kids.E ^ 1);
          bVarsNew = (DdNode *)((ulong)(pDVar2->type).kids.T ^ 1);
        }
      }
      bFR = extraZddGetSymmetricVars(dd,bF1,bG1,(_LevelG->type).kids.T);
      if (bFR == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + 1;
        if (bFR != dd->zero) {
          pDVar1 = extraZddGetSymmetricVars(dd,bG0,bVarsNew,(_LevelG->type).kids.T);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = cuddZddIntersect(dd,bFR,pDVar1);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar1);
          bFR = pDVar2;
        }
        if (bF1 == bVarsNew) {
          pDVar1 = cuddZddGetNode(dd,_LevelG->index << 1,dd->one,dd->zero);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = cuddZddUnion(dd,bFR,pDVar1);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar1);
          bFR = pDVar2;
        }
        if ((bF == bG) && (bVars != _LevelG)) {
          if ((int)bVarsExtra._4_4_ <= dd->perm[bVars->index]) {
            __assert_fail("LevelFG > dd->perm[bVars->index]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                          ,0x3b4,
                          "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)"
                         );
          }
          pDVar1 = cuddBddExistAbstractRecur(dd,bVars,_LevelG);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = extraZddGetSingletons(dd,pDVar1);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar1);
          pDVar1 = cuddZddUnion(dd,bFR,pDVar2);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          bFR = pDVar1;
        }
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + -1;
        cuddCacheInsert(dd,10,bF,bG,bVars,bFR);
        dd_local = (DdManager *)bFR;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraZddGetSymmetricVars( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,       /* the first function  - originally, the positive cofactor */
  DdNode * bG,       /* the second function - originally, the negative cofactor */
  DdNode * bVars)    /* the set of variables, on which F and G depend */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bF); 
    DdNode * bGR = Cudd_Regular(bG); 

    if ( cuddIsConstant(bFR) && cuddIsConstant(bGR) )
    {
        if ( bF == bG )
            return extraZddGetSingletons( dd, bVars );
        else 
            return z0;
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookupZdd(dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;             
        DdNode * zPlus, * zTemp;
        DdNode * bF0, * bF1;             
        DdNode * bG0, * bG1;             
        DdNode * bVarsNew;
    
        int LevelF = cuddI(dd,bFR->index);
        int LevelG = cuddI(dd,bGR->index);
        int LevelFG;

        if ( LevelF < LevelG )
            LevelFG = LevelF;
        else
            LevelFG = LevelG;

        // at least one of the arguments is not a constant
        assert( LevelFG < dd->size );

        // every variable in bF and bG should be also in bVars, therefore LevelFG cannot be above LevelV
        // if LevelFG is below LevelV, scroll through the vars in bVars to the same level as LevelFG
        for ( bVarsNew = bVars; LevelFG > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) );
        assert( LevelFG == dd->perm[bVarsNew->index] );

        // cofactor the functions
        if ( LevelF == LevelFG )
        {
            if ( bFR != bF ) // bF is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else 
            bF0 = bF1 = bF;

        if ( LevelG == LevelFG )
        {
            if ( bGR != bG ) // bG is complemented 
            {
                bG0 = Cudd_Not( cuddE(bGR) );
                bG1 = Cudd_Not( cuddT(bGR) );
            }
            else
            {
                bG0 = cuddE(bGR);
                bG1 = cuddT(bGR);
            }
        }
        else 
            bG0 = bG1 = bG;

        // solve subproblems
        zRes0 = extraZddGetSymmetricVars( dd, bF0, bG0, cuddT(bVarsNew) );
        if ( zRes0 == NULL ) 
            return NULL;
        cuddRef( zRes0 );

        // if there is not symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddGetSymmetricVars( dd, bF1, bG1, cuddT(bVarsNew) );
            if ( zRes1 == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables should belong to the resulting set 
            // for which the property is true for both cofactors
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // add one more singleton if the property is true for this variable
        if ( bF0 == bG1 )
        {
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        if ( bF == bG && bVars != bVarsNew )
        { 
            // if the functions are equal, so are their cofactors
            // add those variables from V that are above F and G 

            DdNode * bVarsExtra;

            assert( LevelFG > dd->perm[bVars->index] );

            // create the BDD of the extra variables
            bVarsExtra = cuddBddExistAbstractRecur( dd, bVars, bVarsNew );
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            zPlus = extraZddGetSingletons( dd, bVarsExtra );
            if ( zPlus == NULL )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );
            Cudd_RecursiveDeref( dd, bVarsExtra );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        cuddCacheInsert( dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars, zRes );
        return zRes;
    }
}